

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void Memory::HeapInfo::ValidPointersMap<SmallAllocationBlockAttributes>::GenerateValidPointersMap
               (ValidPointersMapTable *validTable,InvalidBitsTable *invalidTable,
               BlockInfoMapTable *blockInfoTable)

{
  SmallHeapBlockBitVector *this;
  SmallHeapBlockBitVector *pSVar1;
  BlockInfo *pBVar2;
  undefined1 auVar3 [16];
  Type *pTVar4;
  int iVar5;
  BVIndex i;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ValidPointersMapTable *paauVar11;
  ushort uVar12;
  long lVar13;
  ushort *validInteriorPointers;
  ushort *puVar14;
  long local_48;
  long local_38;
  
  if (validTable != (ValidPointersMapTable *)0x0) {
    memset(validTable,0xff,0xc000);
  }
  local_38 = 1;
  local_48 = 2;
  uVar8 = 0x10;
  lVar9 = 0;
  do {
    puVar14 = (*validTable)[0] + 0x100;
    if (validTable == (ValidPointersMapTable *)0x0) {
      puVar14 = (ushort *)0x0;
    }
    this = *invalidTable + lVar9;
    pTVar4 = (*invalidTable)[lVar9].data;
    *(undefined4 *)&pTVar4[2].word = 0xffffffff;
    *(undefined4 *)((long)&pTVar4[2].word + 4) = 0xffffffff;
    *(undefined4 *)&pTVar4[3].word = 0xffffffff;
    *(undefined4 *)((long)&pTVar4[3].word + 4) = 0xffffffff;
    pSVar1 = *invalidTable + lVar9;
    *(undefined4 *)&pSVar1->data[0].word = 0xffffffff;
    *(undefined4 *)((long)&pSVar1->data[0].word + 4) = 0xffffffff;
    *(undefined4 *)&pSVar1->data[1].word = 0xffffffff;
    *(undefined4 *)((long)&pSVar1->data[1].word + 4) = 0xffffffff;
    pBVar2 = (*blockInfoTable)[lVar9];
    lVar9 = lVar9 + 1;
    pBVar2->lastObjectIndexOnPage = 0;
    pBVar2->pageObjectCount = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    i = 0;
    uVar10 = 0;
    lVar13 = 0;
    paauVar11 = validTable;
    do {
      uVar12 = (ushort)lVar13;
      if (validTable != (ValidPointersMapTable *)0x0) {
        (*paauVar11)[0][0] = uVar12;
      }
      uVar7 = uVar10 >> 0xc & 0xfffff;
      pBVar2[uVar7].pageObjectCount = pBVar2[uVar7].pageObjectCount + 1;
      if (uVar12 <= pBVar2[uVar7].lastObjectIndexOnPage) {
        uVar12 = pBVar2[uVar7].lastObjectIndexOnPage;
      }
      pBVar2[uVar7].lastObjectIndexOnPage = uVar12;
      BVStatic<256UL>::Clear(this,i);
      lVar13 = lVar13 + 1;
      paauVar11 = (ValidPointersMapTable *)((long)(*paauVar11)[0] + local_48);
      uVar10 = uVar10 + uVar8;
      i = i + (int)local_38;
    } while (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / auVar3,0) != lVar13);
    if (puVar14 == (ushort *)0x0) {
      validTable = (ValidPointersMapTable *)0x0;
    }
    else {
      validTable = (ValidPointersMapTable *)(puVar14 + 0x100);
      iVar5 = 0;
      uVar10 = 0;
      do {
        uVar6 = iVar5 * (int)lVar9;
        if (uVar6 < 0x100) {
          uVar6 = uVar6 + (int)lVar9;
          if (0xff < uVar6) {
            uVar6 = 0x100;
          }
          uVar7 = uVar10;
          do {
            puVar14[uVar7] = (ushort)iVar5;
            uVar7 = uVar7 + 1;
          } while (uVar7 < uVar6);
        }
        iVar5 = iVar5 + 1;
        uVar10 = uVar10 + local_38;
      } while (iVar5 != (int)(0x1000 / (uVar8 & 0xffffffff)));
    }
    uVar8 = uVar8 + 0x10;
    local_38 = local_38 + 1;
    local_48 = local_48 + 2;
  } while (lVar9 != 0x30);
  return;
}

Assistant:

void HeapInfo::ValidPointersMap<TBlockAttributes>::GenerateValidPointersMap(ValidPointersMapTable * validTable, InvalidBitsTable& invalidTable, BlockInfoMapTable& blockInfoTable)
{
    // Create the valid pointer map to be shared by the buckets.
    // Also create the invalid objects bit vector.
    ushort * buffer = &((*validTable)[0][0]);
    if (buffer)
    {
        memset(buffer, -1, sizeof(ushort) * 2 * TBlockAttributes::MaxSmallObjectCount * TBlockAttributes::BucketCount);
    }

    for (uint i = 0; i < TBlockAttributes::BucketCount; i++)
    {
        // Non-interior first
        ushort * validPointers = buffer;
        if (buffer)
        {            
            buffer += TBlockAttributes::MaxSmallObjectCount;
        }

        typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector * invalidBitVector = &invalidTable[i];
        invalidBitVector->SetAll();

        uint bucketSize;

        if (TBlockAttributes::IsSmallBlock)
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::ObjectGranularity * i;
        }
        else
        {
            bucketSize = TBlockAttributes::MinObjectSize + HeapConstants::MediumObjectGranularity * (i + 1);
        }

        uint stride = bucketSize / HeapConstants::ObjectGranularity;
        uint maxObjectCountForBucket = ((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucketSize);

        BlockInfoMapRow* blockInfoRow = &blockInfoTable[i];

        memset(blockInfoRow, 0, sizeof(BlockInfoMapRow));

        for (ushort j = 0; j < maxObjectCountForBucket; j++)
        {
            if (validPointers)
            {
                validPointers[j * stride] = j;
            }

            uintptr_t objectAddress = j * bucketSize;
            Assert(objectAddress / AutoSystemInfo::PageSize < USHRT_MAX);
            ushort pageIndex = (ushort)(objectAddress / AutoSystemInfo::PageSize);

            (*blockInfoRow)[pageIndex].pageObjectCount++;
            (*blockInfoRow)[pageIndex].lastObjectIndexOnPage = max(j, (*blockInfoRow)[pageIndex].lastObjectIndexOnPage);

            invalidBitVector->Clear(j * stride);
        }

        if (buffer)
        {
            // interior pointer
            ushort * validInteriorPointers = buffer;
            buffer += TBlockAttributes::MaxSmallObjectCount;
            for (ushort j = 0; j < maxObjectCountForBucket; j++)
            {
                uint start = j * stride;
                uint end = min(start + stride, TBlockAttributes::MaxSmallObjectCount);
                for (uint k = start; k < end; k++)
                {
                    validInteriorPointers[k] = j;
                }
            }
        }
    }
}